

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeMapRef.h
# Opt level: O0

void __thiscall
GenApi_3_4::CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>::Attach
          (CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams> *this,INodeMap *pNodeMap,
          gcstring *DeviceName,int *pRefCount)

{
  _func_int **in_RCX;
  gcstring *in_RDX;
  _func_int **in_RSI;
  CGeneric_XMLLoaderParams *in_RDI;
  
  if ((gcstring *)(in_RDI + 2) != in_RDX) {
    GenICam_3_4::gcstring::operator=((gcstring *)(in_RDI + 2),in_RDX);
  }
  if ((in_RSI != (_func_int **)0x0) && (in_RCX != (_func_int **)0x0)) {
    *(int *)in_RCX = *(int *)in_RCX + 1;
    in_RDI[1]._vptr_CGeneric_XMLLoaderParams = in_RSI;
    in_RDI[0xc]._vptr_CGeneric_XMLLoaderParams = in_RCX;
    CGeneric_XMLLoaderParams::_Initialize
              (in_RDI,(INodeMap *)in_RDI[1]._vptr_CGeneric_XMLLoaderParams);
  }
  return;
}

Assistant:

void GENAPI_NAMESPACE::CNodeMapRefT<TCameraParams>::Attach(INodeMap *pNodeMap, const GENICAM_NAMESPACE::gcstring &DeviceName, int* pRefCount)
    {
        // Must be empty
        assert(_Ptr == NULL);
        assert(_pRefCount == NULL);

        //always copy device name
        if (&_DeviceName != &DeviceName) //if not assigning member itself
        {
            _DeviceName = DeviceName;
        }

        // Attach
        if (pNodeMap)
        {
            assert(pRefCount);
            if (pRefCount)
            {
                ++*pRefCount;

                //assign new node map data
                _Ptr = pNodeMap;
                _pRefCount = pRefCount;

                // Initialize the references
                TCameraParams::_Initialize(_Ptr);
            }
        }
    }